

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O0

function<void_(BaseSocket_*)> * __thiscall
BaseSocket::BindCloseFunction
          (function<void_(BaseSocket_*)> *__return_storage_ptr__,BaseSocket *this,
          function<void_(BaseSocket_*)> *fClosing)

{
  BaseSocketImpl *pBVar1;
  function<void_(BaseSocket_*)> local_40;
  function<void_(BaseSocket_*)> *local_20;
  function<void_(BaseSocket_*)> *fClosing_local;
  BaseSocket *this_local;
  
  local_20 = fClosing;
  fClosing_local = (function<void_(BaseSocket_*)> *)this;
  this_local = (BaseSocket *)__return_storage_ptr__;
  pBVar1 = GetImpl(this);
  std::function<void_(BaseSocket_*)>::function(&local_40,fClosing);
  (*pBVar1->_vptr_BaseSocketImpl[5])(__return_storage_ptr__,pBVar1,&local_40);
  std::function<void_(BaseSocket_*)>::~function(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::function<void(BaseSocket*)> BaseSocket::BindCloseFunction(std::function<void(BaseSocket*)> fClosing)
{
    return GetImpl()->BindCloseFunction(fClosing);
}